

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

void cmdline_run_saved(Conf *conf)

{
  cmdline_saved_param_set *pcVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    pcVar1 = saves + lVar3;
    if (saves[lVar3].nsaved != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        cmdline_process_param
                  (*(char **)((long)&pcVar1->params->p + lVar5),
                   *(char **)((long)&pcVar1->params->value + lVar5),0,conf);
        safefree(*(void **)((long)&pcVar1->params->p + lVar5));
        safefree(*(void **)((long)&pcVar1->params->value + lVar5));
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < saves[lVar3].nsaved);
    }
    saves[lVar3].nsaved = 0;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void cmdline_run_saved(Conf *conf)
{
    for (size_t pri = 0; pri < NPRIORITIES; pri++) {
        for (size_t i = 0; i < saves[pri].nsaved; i++) {
            cmdline_process_param(saves[pri].params[i].p,
                                  saves[pri].params[i].value, 0, conf);
            sfree(saves[pri].params[i].p);
            sfree(saves[pri].params[i].value);
        }
        saves[pri].nsaved = 0;
    }
}